

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::StringFixture::convert<unsigned_char*>
          (string *__return_storage_ptr__,void *this,uchar *begin,uchar *end)

{
  string *psVar1;
  string *extraout_RAX;
  StringFixture *local_38;
  string *local_30;
  StringFixture local_28;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<unsigned_char*>((string *)&local_38);
  psVar1 = anon_unknown.dwarf_1c7603::StringFixture::convert
                     (__return_storage_ptr__,local_38,local_30);
  if (local_38 != &local_28) {
    operator_delete(local_38,(long)local_28.super_Test._vptr_Test + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string StringFixture::convert (InputIterator begin, InputIterator end) const {
        return this->convert ({begin, end});
    }